

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  undefined8 *puVar1;
  void *pvVar2;
  int in_EAX;
  long lVar3;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long lVar4;
  
  if (0 < ncomp) {
    lVar3 = (ulong)(uint)ncomp * 0x20;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)&z->img_comp[0].raw_data + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        puVar1 = (undefined8 *)((long)&z->img_comp[0].data + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar3 = extraout_RAX;
      }
      pvVar2 = *(void **)((long)&z->img_comp[0].raw_coeff + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar4) = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar4) = 0;
        lVar3 = extraout_RAX_00;
      }
      pvVar2 = *(void **)((long)&z->img_comp[0].linebuf + lVar4);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar4) = 0;
        lVar3 = extraout_RAX_01;
      }
      in_EAX = (int)lVar3;
      lVar4 = lVar4 + 0x60;
    } while ((ulong)(uint)ncomp * 0x60 != lVar4);
  }
  return in_EAX;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}